

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_write_poc_in_memory
               (opj_j2k_t *p_j2k,OPJ_BYTE *p_data,OPJ_UINT32 *p_data_written,
               opj_event_mgr_t *p_manager)

{
  uint uVar1;
  uint b;
  opj_tcp_t *poVar2;
  opj_tccp_t *poVar3;
  uint uVar4;
  int iVar5;
  OPJ_UINT32 OVar6;
  OPJ_BYTE *pOVar7;
  uint local_6c;
  opj_poc_t *poStack_68;
  OPJ_UINT32 l_poc_room;
  opj_poc_t *l_current_poc;
  opj_tccp_t *l_tccp;
  opj_tcp_t *l_tcp;
  opj_image_t *l_image;
  OPJ_UINT32 l_poc_size;
  OPJ_UINT32 l_nb_poc;
  OPJ_UINT32 l_nb_comp;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 i;
  opj_event_mgr_t *p_manager_local;
  OPJ_UINT32 *p_data_written_local;
  OPJ_BYTE *p_data_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xcf0,
                  "void opj_j2k_write_poc_in_memory(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    poVar2 = (p_j2k->m_cp).tcps;
    uVar1 = p_j2k->m_current_tile_number;
    poVar3 = poVar2[uVar1].tccps;
    b = p_j2k->m_private_image->numcomps;
    uVar4 = poVar2[uVar1].numpocs + 1;
    if (b < 0x101) {
      local_6c = 1;
    }
    else {
      local_6c = 2;
    }
    iVar5 = (local_6c * 2 + 5) * uVar4;
    opj_write_bytes_LE(p_data,0xff5f,2);
    opj_write_bytes_LE(p_data + 2,iVar5 + 2,2);
    _l_nb_poc = p_data + 4;
    poStack_68 = poVar2[uVar1].pocs;
    for (l_current_data._4_4_ = 0; l_current_data._4_4_ < uVar4;
        l_current_data._4_4_ = l_current_data._4_4_ + 1) {
      opj_write_bytes_LE(_l_nb_poc,poStack_68->resno0,1);
      opj_write_bytes_LE(_l_nb_poc + 1,poStack_68->compno0,local_6c);
      pOVar7 = _l_nb_poc + 1 + local_6c;
      opj_write_bytes_LE(pOVar7,poStack_68->layno1,2);
      opj_write_bytes_LE(pOVar7 + 2,poStack_68->resno1,1);
      pOVar7 = pOVar7 + 3;
      opj_write_bytes_LE(pOVar7,poStack_68->compno1,local_6c);
      opj_write_bytes_LE(pOVar7 + local_6c,poStack_68->prg,1);
      _l_nb_poc = pOVar7 + local_6c + 1;
      OVar6 = opj_int_min(poStack_68->layno1,poVar2[uVar1].numlayers);
      poStack_68->layno1 = OVar6;
      OVar6 = opj_int_min(poStack_68->resno1,poVar3->numresolutions);
      poStack_68->resno1 = OVar6;
      OVar6 = opj_int_min(poStack_68->compno1,b);
      poStack_68->compno1 = OVar6;
      poStack_68 = poStack_68 + 1;
    }
    *p_data_written = iVar5 + 4;
    return;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xcf1,
                "void opj_j2k_write_poc_in_memory(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32 *, opj_event_mgr_t *)"
               );
}

Assistant:

static void opj_j2k_write_poc_in_memory(opj_j2k_t *p_j2k,
                                        OPJ_BYTE * p_data,
                                        OPJ_UINT32 * p_data_written,
                                        opj_event_mgr_t * p_manager
                                       )
{
    OPJ_UINT32 i;
    OPJ_BYTE * l_current_data = 00;
    OPJ_UINT32 l_nb_comp;
    OPJ_UINT32 l_nb_poc;
    OPJ_UINT32 l_poc_size;
    opj_image_t *l_image = 00;
    opj_tcp_t *l_tcp = 00;
    opj_tccp_t *l_tccp = 00;
    opj_poc_t *l_current_poc = 00;
    OPJ_UINT32 l_poc_room;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_manager);

    l_tcp = &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number];
    l_tccp = &l_tcp->tccps[0];
    l_image = p_j2k->m_private_image;
    l_nb_comp = l_image->numcomps;
    l_nb_poc = 1 + l_tcp->numpocs;

    if (l_nb_comp <= 256) {
        l_poc_room = 1;
    } else {
        l_poc_room = 2;
    }

    l_poc_size = 4 + (5 + 2 * l_poc_room) * l_nb_poc;

    l_current_data = p_data;

    opj_write_bytes(l_current_data, J2K_MS_POC,
                    2);                                   /* POC  */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_poc_size - 2,
                    2);                                 /* Lpoc */
    l_current_data += 2;

    l_current_poc =  l_tcp->pocs;
    for (i = 0; i < l_nb_poc; ++i) {
        opj_write_bytes(l_current_data, l_current_poc->resno0,
                        1);                                /* RSpoc_i */
        ++l_current_data;

        opj_write_bytes(l_current_data, l_current_poc->compno0,
                        l_poc_room);              /* CSpoc_i */
        l_current_data += l_poc_room;

        opj_write_bytes(l_current_data, l_current_poc->layno1,
                        2);                                /* LYEpoc_i */
        l_current_data += 2;

        opj_write_bytes(l_current_data, l_current_poc->resno1,
                        1);                                /* REpoc_i */
        ++l_current_data;

        opj_write_bytes(l_current_data, l_current_poc->compno1,
                        l_poc_room);              /* CEpoc_i */
        l_current_data += l_poc_room;

        opj_write_bytes(l_current_data, (OPJ_UINT32)l_current_poc->prg,
                        1);   /* Ppoc_i */
        ++l_current_data;

        /* change the value of the max layer according to the actual number of layers in the file, components and resolutions*/
        l_current_poc->layno1 = (OPJ_UINT32)opj_int_min((OPJ_INT32)
                                l_current_poc->layno1, (OPJ_INT32)l_tcp->numlayers);
        l_current_poc->resno1 = (OPJ_UINT32)opj_int_min((OPJ_INT32)
                                l_current_poc->resno1, (OPJ_INT32)l_tccp->numresolutions);
        l_current_poc->compno1 = (OPJ_UINT32)opj_int_min((OPJ_INT32)
                                 l_current_poc->compno1, (OPJ_INT32)l_nb_comp);

        ++l_current_poc;
    }

    *p_data_written = l_poc_size;
}